

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O2

void TestObject::Visit<StressTester::Run()::__0>
               (Recycler *recycler,TestObject *root,anon_class_8_1_a8a4b1a8 fn)

{
  TestObject *pTVar1;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<TestObject>,_bool> *pSVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Recycler *pRVar6;
  BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this;
  List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00;
  Type *pTVar7;
  TestObject *pTVar8;
  ulong uVar9;
  int i;
  int iVar10;
  undefined1 local_80 [8];
  TrackAllocData data;
  TestObject *root_local;
  bool local_31;
  
  local_80 = (undefined1  [8])
             &JsUtil::
              BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_274e31f;
  data.filename._0_4_ = 0x6c;
  data._32_8_ = root;
  pRVar6 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_80);
  this = (BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          *)new<Memory::Recycler>(0x38,pRVar6,0x37a1d4);
  (this->buckets).ptr = (int *)0x0;
  (this->entries).ptr = (SimpleDictionaryEntry<Memory::WriteBarrierPtr<TestObject>,_bool> *)0x0;
  this->alloc = recycler;
  this->size = 0;
  this->bucketCount = 0;
  this->count = 0;
  this->freeCount = 0;
  this->modFunctionIndex = 0x4b;
  this->stats = (Type)0x0;
  local_80 = (undefined1  [8])
             &JsUtil::List<TestObject*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_274e31f;
  data.filename._0_4_ = 0x6d;
  pRVar6 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_80);
  this_00 = (List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
            new<Memory::Recycler>(0x30,pRVar6,0x37a1d4);
  (this_00->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).alloc = recycler;
  (this_00->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>)._vptr_ReadOnlyList
       = (_func_int **)&PTR_IsReadOnly_01376e60;
  (this_00->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).buffer.ptr =
       (WriteBarrierPtr<TestObject> *)0x0;
  (this_00->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count = 0;
  this_00->length = 0;
  this_00->increment = 4;
  JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
            (this_00,(TestObject **)&data.line);
  local_80[0] = 1;
  JsUtil::
  BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)this,(TestObject **)&data.line,(bool *)local_80);
  while (0 < (this_00->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count) {
    pTVar7 = JsUtil::
             List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
             Item(this_00,0);
    pTVar1 = pTVar7->ptr;
    JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    RemoveAt(this_00,0);
    CheckCookie(pTVar1);
    for (iVar10 = 0; iVar10 < pTVar1->pointerCount; iVar10 = iVar10 + 1) {
      local_80 = (undefined1  [8])Get(pTVar1,iVar10);
      if (local_80 != (undefined1  [8])0x0) {
        bVar3 = JsUtil::
                BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::ContainsKey(this,(TestObject **)local_80);
        if (!bVar3) {
          local_31 = true;
          JsUtil::
          BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                    ((BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this,(TestObject **)local_80,&local_31);
          JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(this_00,(TestObject **)local_80);
        }
      }
    }
  }
  for (uVar9 = 0; uVar9 < this->bucketCount; uVar9 = uVar9 + 1) {
    iVar10 = (this->buckets).ptr[uVar9];
    if (iVar10 != -1) {
      while (iVar10 != -1) {
        pSVar2 = (this->entries).ptr;
        iVar5 = pSVar2[iVar10].
                super_DefaultHashedEntry<Memory::WriteBarrierPtr<TestObject>,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<Memory::WriteBarrierPtr<TestObject>,_bool>.
                super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<TestObject>,_bool>_>
                .super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<TestObject>,_bool>.next;
        pTVar1 = pSVar2[iVar10].
                 super_DefaultHashedEntry<Memory::WriteBarrierPtr<TestObject>,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<Memory::WriteBarrierPtr<TestObject>,_bool>.
                 super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<TestObject>,_bool>_>
                 .super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<TestObject>,_bool>.key.ptr;
        iVar10 = PAL_rand();
        if (iVar10 % 5 == 0) {
          ClearOne(pTVar1);
        }
        iVar10 = PAL_rand();
        if (iVar10 % 0x19 == 0) {
          SetRandom(*fn.stack,pTVar1);
        }
        iVar4 = PAL_rand();
        iVar10 = iVar5;
        if (iVar4 % 0x19 == 0) {
          pTVar8 = *fn.stack;
          iVar5 = PAL_rand();
          pTVar8 = Get(pTVar8,iVar5 % (*fn.stack)->pointerCount);
          SetRandom(pTVar1,pTVar8);
        }
      }
    }
  }
  return;
}

Assistant:

void TestObject::Visit(Recycler *recycler, TestObject *root, Fn fn)
{
    // TODO: move these allocations to HeapAllocator.

    ObjectTracker_t *objectTracker = RecyclerNew(recycler, ObjectTracker_t, recycler);
    ObjectList_t *objectList = RecyclerNew(recycler, ObjectList_t, recycler);

    // Prime the list with the first object
    objectList->Add(root);
    objectTracker->Add(root, true);

    int numObjects = 0;
    while (objectList->Count() > 0)
    {
        TestObject *curr = objectList->Item(0);
        objectList->RemoveAt(0);

        curr->CheckCookie();
        for (int i = 0; i < curr->pointerCount; ++i)
        {
            TestObject *obj = curr->Get(i);
            if (obj != nullptr /*&& IsAligned<64>(obj)*/ && !objectTracker->ContainsKey(obj))
            {
                objectTracker->Add(obj, true);
                objectList->Add(obj);
            }
        }

        ++numObjects;
    }

    objectTracker->Map([&](TestObject * val, bool) {
        fn(val);
    });

}